

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O3

void __thiscall flatbuffers::CodeWriter::AppendIdent(CodeWriter *this,stringstream *stream)

{
  int iVar1;
  
  iVar1 = this->cur_ident_lvl_;
  if (iVar1 != 0) {
    do {
      std::ostream::write((char *)(stream + 0x10),(long)(this->pad_)._M_dataplus._M_p);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void CodeWriter::AppendIdent(std::stringstream &stream) {
  int lvl = cur_ident_lvl_;
  while (lvl--) {
    stream.write(pad_.c_str(), static_cast<std::streamsize>(pad_.size()));
  }
}